

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzero.cpp
# Opt level: O0

Machine * unify(Machine *__return_storage_ptr__,Machine *m,Addr a1,Addr a2)

{
  Addr a2_00;
  Addr a1_00;
  Addr a;
  bool bVar1;
  mapped_type *pmVar2;
  Addr AVar3;
  Hix local_568;
  int local_564;
  Addr local_560;
  Hix local_554;
  int local_550;
  Addr local_54c;
  Machine local_540;
  Machine local_4d0;
  int local_460;
  key_type local_45c;
  int i;
  Functor f2;
  undefined1 local_428 [8];
  Functor f1;
  Machine local_3b8;
  Addr local_348;
  Addr local_338;
  Machine local_328;
  undefined1 local_2b8 [8];
  Hcell h2;
  Machine local_268;
  undefined1 local_1f8 [8];
  Hcell h1;
  Machine local_198;
  undefined1 local_124 [8];
  Addr d2;
  Machine local_d8;
  undefined1 local_68 [8];
  Addr d1;
  Machine *m_local;
  Addr a2_local;
  Addr a1_local;
  
  unique0x10000510 = m;
  Machine::Machine(&local_d8,m);
  AVar3 = deref(&local_d8,a1);
  d1.tag_ = (AddrTag)AVar3.hix_.hix;
  d2._4_8_ = AVar3._0_8_;
  local_68 = (undefined1  [8])d2._4_8_;
  Machine::~Machine(&local_d8);
  Machine::Machine(&local_198,m);
  AVar3 = deref(&local_198,a2);
  d2.tag_ = (AddrTag)AVar3.hix_.hix;
  h1.f_._32_8_ = AVar3._0_8_;
  local_124 = (undefined1  [8])h1.f_._32_8_;
  Machine::~Machine(&local_198);
  bVar1 = Addr::operator==((Addr *)local_68,(Addr *)local_124);
  if (bVar1) {
    Machine::Machine(__return_storage_ptr__,m);
  }
  else {
    Machine::Machine(&local_268,m);
    h2.f_._32_8_ = local_68;
    a.hix_.hix = d1.tag_;
    a.tag_ = local_68._0_4_;
    a.r_.r = local_68._4_4_;
    machineAtAddr((Hcell *)local_1f8,&local_268,a);
    Machine::~Machine(&local_268);
    Machine::Machine(&local_328,m);
    local_338.hix_.hix = d2.tag_;
    local_338.tag_ = local_124._0_4_;
    local_338.r_.r = local_124._4_4_;
    local_348.hix_.hix = d2.tag_;
    local_348.tag_ = local_124._0_4_;
    local_348.r_.r = local_124._4_4_;
    AVar3.hix_.hix = d2.tag_;
    AVar3.tag_ = local_124._0_4_;
    AVar3.r_.r = local_124._4_4_;
    machineAtAddr((Hcell *)local_2b8,&local_328,AVar3);
    Machine::~Machine(&local_328);
    if ((local_1f8._0_4_ == Ref) || (local_2b8._0_4_ == Ref)) {
      Machine::Machine(&local_3b8,m);
      bind((int)__return_storage_ptr__,(sockaddr *)&local_3b8,local_68._0_4_);
      Machine::~Machine(&local_3b8);
    }
    else {
      f2._36_4_ = Hcell::hix((Hcell *)local_1f8);
      pmVar2 = std::map<Hix,_Hcell,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>::
               operator[](&m->heap,(key_type *)&f2.field_0x24);
      Hcell::operator_cast_to_Functor((Functor *)local_428,pmVar2);
      local_45c.hix = (int)Hcell::hix((Hcell *)local_2b8);
      pmVar2 = std::map<Hix,_Hcell,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>::
               operator[](&m->heap,&local_45c);
      Hcell::operator_cast_to_Functor((Functor *)&i,pmVar2);
      bVar1 = Functor::operator==((Functor *)local_428,(Functor *)&i);
      if (!bVar1) {
        __assert_fail("f1 == f2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/bollu[P]warren-cpp/src/lzero.cpp"
                      ,0x157,"Machine unify(Machine, Addr, Addr)");
      }
      for (local_460 = 1; local_460 <= (int)f1._24_4_; local_460 = local_460 + 1) {
        Machine::Machine(&local_540,m);
        local_554 = Hcell::hix((Hcell *)local_1f8);
        local_550 = (int)Hix::operator+(&local_554,local_460);
        Addr::Addr(&local_54c,(Hix)local_550);
        local_568 = Hcell::hix((Hcell *)local_2b8);
        local_564 = (int)Hix::operator+(&local_568,local_460);
        Addr::Addr(&local_560,(Hix)local_564);
        a1_00.hix_.hix = local_54c.hix_.hix;
        a1_00.tag_ = local_54c.tag_;
        a1_00.r_.r = local_54c.r_.r;
        a2_00.hix_.hix = local_560.hix_.hix;
        a2_00.tag_ = local_560.tag_;
        a2_00.r_.r = local_560.r_.r;
        unify(&local_4d0,&local_540,a1_00,a2_00);
        Machine::operator=(m,&local_4d0);
        Machine::~Machine(&local_4d0);
        Machine::~Machine(&local_540);
      }
      Functor::~Functor((Functor *)&i);
      Functor::~Functor((Functor *)local_428);
      Machine::Machine(__return_storage_ptr__,m);
    }
    f1._36_4_ = 1;
    Hcell::~Hcell((Hcell *)local_2b8);
    Hcell::~Hcell((Hcell *)local_1f8);
  }
  return __return_storage_ptr__;
}

Assistant:

Machine unify(Machine m, Addr a1, Addr a2) {
    Addr d1 = deref(m, a1), d2 = deref(m, a2);
    if (d1 == d2) return m;

    Hcell h1 = machineAtAddr(m, d1), h2 = machineAtAddr(m, d2);

    if (h1.tag == Htag::Ref || h2.tag == Htag::Ref) {
        return bind(m, d1, d2);
    } else {
        Functor f1 = m.heap[h1.hix()], f2 = m.heap[h2.hix()];
        assert(f1 == f2);

        for (int i = 1; i <= f1.arity; i++) {
            // We now union the subterms of the functor
            m = unify(m, h1.hix() + i, h2.hix() + i);
        }
    }

    return m;
}